

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O1

void free_descriptor(DESCRIPTOR_DATA *d)

{
  if ((d != (DESCRIPTOR_DATA *)0x0) && (d->valid == true)) {
    free_pstring(d->host);
    if (d->outbuf != (char *)0x0) {
      operator_delete__(d->outbuf);
    }
    d->valid = false;
    d->next = descriptor_free;
    descriptor_free = d;
  }
  return;
}

Assistant:

void free_descriptor(DESCRIPTOR_DATA *d)
{
	if (!(d != nullptr && d->valid))
		return;

	free_pstring(d->host);

	if (d->outbuf)
		delete[] d->outbuf;

	d->valid = false;
	d->next = descriptor_free;
	descriptor_free = d;
}